

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_scalingFactorBetweenBaseUnitsSameName_Test::~Units_scalingFactorBetweenBaseUnitsSameName_Test
          (Units_scalingFactorBetweenBaseUnitsSameName_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, scalingFactorBetweenBaseUnitsSameName)
{
    auto model = libcellml::Model::create("model");
    auto u1 = libcellml::Units::create("units");
    model->addUnits(u1);

    auto u2 = libcellml::Units::create("units");
    model->addUnits(u2);

    auto scaling = libcellml::Units::scalingFactor(u1, u2);
    EXPECT_EQ(1.0, scaling);
}